

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLog>
               (GetterXsYs<int> *getter,TransformerLogLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  ImPlotPlot *pIVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  ImPlotContext *pIVar10;
  ImPlotContext *pIVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ImPlotContext *gp;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLogLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar10 = GImPlot;
  pIVar6 = GImPlot->CurrentPlot;
  if (((pIVar6->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar13 = getter->Count;
    local_48 = iVar13 + -1;
    lVar12 = (long)((getter->Offset % iVar13 + iVar13) % iVar13) * (long)getter->Stride;
    iVar13 = *(int *)((long)getter->Ys + lVar12);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar7 = log10((double)*(int *)((long)getter->Xs + lVar12) / (pIVar6->XAxis).Range.Min);
    pIVar6 = pIVar10->CurrentPlot;
    dVar2 = pIVar10->LogDenX;
    dVar3 = (pIVar6->XAxis).Range.Min;
    dVar4 = (pIVar6->XAxis).Range.Max;
    dVar8 = log10((double)iVar13 / pIVar6->YAxis[transformer->YAxis].Range.Min);
    iVar13 = transformer->YAxis;
    pIVar6 = pIVar10->CurrentPlot;
    auVar19._8_8_ = dVar8;
    auVar19._0_8_ = dVar7;
    auVar22._8_8_ = pIVar10->LogDenY[iVar13];
    auVar22._0_8_ = dVar2;
    auVar17 = divpd(auVar19,auVar22);
    dVar2 = pIVar6->YAxis[iVar13].Range.Min;
    IVar5 = pIVar10->PixelRange[iVar13].Min;
    local_3c.y = (float)(pIVar10->My[iVar13] *
                         (((double)(float)auVar17._8_8_ * (pIVar6->YAxis[iVar13].Range.Max - dVar2)
                          + dVar2) - dVar2) + (double)IVar5.y);
    local_3c.x = (float)(pIVar10->Mx *
                         (((double)(float)auVar17._0_8_ * (dVar4 - dVar3) + dVar3) -
                         (pIVar6->XAxis).Range.Min) + (double)IVar5.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLog>>
              ((LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLog> *)local_58,
               DrawList,&pIVar6->PlotRect);
  }
  else {
    iVar13 = getter->Count;
    lVar12 = (long)((getter->Offset % iVar13 + iVar13) % iVar13) * (long)getter->Stride;
    iVar13 = *(int *)((long)getter->Ys + lVar12);
    dVar7 = log10((double)*(int *)((long)getter->Xs + lVar12) / (pIVar6->XAxis).Range.Min);
    pIVar6 = pIVar10->CurrentPlot;
    dVar2 = pIVar10->LogDenX;
    dVar3 = (pIVar6->XAxis).Range.Min;
    dVar4 = (pIVar6->XAxis).Range.Max;
    dVar8 = log10((double)iVar13 / pIVar6->YAxis[transformer->YAxis].Range.Min);
    iVar13 = transformer->YAxis;
    pIVar6 = pIVar10->CurrentPlot;
    auVar20._8_8_ = pIVar10->LogDenY[iVar13];
    auVar20._0_8_ = dVar2;
    auVar17._8_8_ = dVar8;
    auVar17._0_8_ = dVar7;
    auVar17 = divpd(auVar17,auVar20);
    dVar2 = pIVar6->YAxis[iVar13].Range.Min;
    IVar5 = pIVar10->PixelRange[iVar13].Min;
    local_58._4_4_ =
         (float)(pIVar10->My[iVar13] *
                 (((double)(float)auVar17._8_8_ * (pIVar6->YAxis[iVar13].Range.Max - dVar2) + dVar2)
                 - dVar2) + (double)IVar5.y);
    local_58._0_4_ =
         (float)(pIVar10->Mx *
                 (((double)(float)auVar17._0_8_ * (dVar4 - dVar3) + dVar3) -
                 (pIVar6->XAxis).Range.Min) + (double)IVar5.x);
    iVar13 = getter->Count;
    if (1 < iVar13) {
      iVar14 = 1;
      do {
        pIVar11 = GImPlot;
        lVar12 = (long)(((getter->Offset + iVar14) % iVar13 + iVar13) % iVar13) *
                 (long)getter->Stride;
        iVar13 = *(int *)((long)getter->Ys + lVar12);
        dVar7 = log10((double)*(int *)((long)getter->Xs + lVar12) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar6 = pIVar11->CurrentPlot;
        dVar2 = pIVar11->LogDenX;
        dVar3 = (pIVar6->XAxis).Range.Min;
        dVar4 = (pIVar6->XAxis).Range.Max;
        dVar8 = log10((double)iVar13 / pIVar6->YAxis[transformer->YAxis].Range.Min);
        iVar13 = transformer->YAxis;
        pIVar6 = pIVar11->CurrentPlot;
        auVar18._8_8_ = dVar8;
        auVar18._0_8_ = dVar7;
        auVar21._8_8_ = pIVar11->LogDenY[iVar13];
        auVar21._0_8_ = dVar2;
        auVar17 = divpd(auVar18,auVar21);
        dVar2 = pIVar6->YAxis[iVar13].Range.Min;
        IVar5 = pIVar11->PixelRange[iVar13].Min;
        fVar15 = (float)(pIVar11->Mx *
                         (((double)(float)auVar17._0_8_ * (dVar4 - dVar3) + dVar3) -
                         (pIVar6->XAxis).Range.Min) + (double)IVar5.x);
        fVar16 = (float)(pIVar11->My[iVar13] *
                         (((double)(float)auVar17._8_8_ * (pIVar6->YAxis[iVar13].Range.Max - dVar2)
                          + dVar2) - dVar2) + (double)IVar5.y);
        local_60.y = fVar16;
        local_60.x = fVar15;
        pIVar6 = pIVar10->CurrentPlot;
        fVar9 = (float)local_58._4_4_;
        if (fVar16 <= (float)local_58._4_4_) {
          fVar9 = fVar16;
        }
        if ((fVar9 < (pIVar6->PlotRect).Max.y) &&
           (fVar9 = (float)(~-(uint)(fVar16 <= (float)local_58._4_4_) & (uint)fVar16 |
                           local_58._4_4_ & -(uint)(fVar16 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar9 && fVar9 != *pfVar1)) {
          fVar9 = (float)local_58._0_4_;
          if (fVar15 <= (float)local_58._0_4_) {
            fVar9 = fVar15;
          }
          if ((fVar9 < (pIVar6->PlotRect).Max.x) &&
             (fVar9 = (float)(-(uint)(fVar15 <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(fVar15 <= (float)local_58._0_4_) & (uint)fVar15),
             (pIVar6->PlotRect).Min.x <= fVar9 && fVar9 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar14 = iVar14 + 1;
        iVar13 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar14 < iVar13);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}